

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

QByteArray * __thiscall
QStringBuilder<QByteArray_&,_QByteArray_&>::convertTo<QByteArray>
          (QStringBuilder<QByteArray_&,_QByteArray_&> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  DataPointer *this_00;
  QByteArray *in_RSI;
  QStringBuilder<QByteArray_&,_QByteArray_&> *in_RDI;
  long in_FS_OFFSET;
  iterator start;
  qsizetype len;
  QByteArray *s;
  iterator d;
  undefined4 in_stack_ffffffffffffffa8;
  Initialization in_stack_ffffffffffffffac;
  QStringBuilder<QByteArray_&,_QByteArray_&> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  bVar2 = isNull(in_RDI);
  if (bVar2) {
    QByteArray::QByteArray((QByteArray *)0x16ff0c);
  }
  else {
    qVar3 = QConcatenable<QStringBuilder<QByteArray_&,_QByteArray_&>_>::size(in_RDI);
    in_RDI->a = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI->b = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    in_RDI[1].a = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)this_01,(qsizetype)in_RDI,in_stack_ffffffffffffffac);
    this_00 = QByteArray::data_ptr((QByteArray *)in_RDI);
    QArrayDataPointer<char>::data(this_00);
    QConcatenable<QStringBuilder<QByteArray_&,_QByteArray_&>_>::appendTo<char>
              (in_RDI,(char **)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (qVar3 != 0) {
      QByteArray::resize(in_RSI,(qsizetype)this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QByteArray *)this_01;
  }
  __stack_chk_fail();
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }